

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPML_ECC_CURVE_Unmarshal(TPML_ECC_CURVE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPML_ECC_CURVE *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(&target->count,buffer,size);
  if (target_local._4_4_ == 0) {
    if (target->count < 0x1fd) {
      target_local._4_4_ =
           TPM_ECC_CURVE_Array_Unmarshal(target->eccCurves,buffer,size,target->count);
    }
    else {
      target_local._4_4_ = 0x84;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPML_ECC_CURVE_Unmarshal(TPML_ECC_CURVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_ECC_CURVES)
        return TPM_RC_VALUE;
    result = TPM_ECC_CURVE_Array_Unmarshal((TPM_ECC_CURVE *)(target->eccCurves), buffer, size, (INT32)(target->count));
    return result;
}